

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O1

void __thiscall
QSharedDataPointer<QHttp2ConfigurationPrivate>::reset
          (QSharedDataPointer<QHttp2ConfigurationPrivate> *this,QHttp2ConfigurationPrivate *ptr)

{
  QHttp2ConfigurationPrivate *pQVar1;
  
  if ((this->d).ptr != ptr) {
    if (ptr != (QHttp2ConfigurationPrivate *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    pQVar1 = (this->d).ptr;
    (this->d).ptr = ptr;
    if (pQVar1 != (QHttp2ConfigurationPrivate *)0x0) {
      LOCK();
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> + -1);
      UNLOCK();
      if ((__int_type)
          (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> == 0) {
        operator_delete(pQVar1,0x18);
        return;
      }
    }
  }
  return;
}

Assistant:

void reset(T *ptr = nullptr) noexcept
    {
        if (ptr != d.get()) {
            if (ptr)
                ptr->ref.ref();
            T *old = std::exchange(d, Qt::totally_ordered_wrapper(ptr)).get();
            if (old && !old->ref.deref())
                delete old;
        }
    }